

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSVparser.cpp
# Opt level: O1

string * __thiscall
csv::Row::operator[][abi_cxx11_(string *__return_storage_ptr__,Row *this,uint valuePosition)

{
  pointer pbVar1;
  pointer pcVar2;
  ulong uVar3;
  Error *this_00;
  string local_40;
  
  uVar3 = (ulong)valuePosition;
  pbVar1 = (this->_values).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(this->_values).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = pbVar1[uVar3]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + pbVar1[uVar3]._M_string_length);
    return __return_storage_ptr__;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"can\'t return this value (doesn\'t exist)","");
  Error::Error(this_00,&local_40);
  __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const std::string Row::operator[](unsigned int valuePosition) const
  {
       if (valuePosition < _values.size())
           return _values[valuePosition];
       throw Error("can't return this value (doesn't exist)");
  }